

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdD3D56TlvRhw::emulate_mthd(MthdD3D56TlvRhw *this)

{
  uint32_t *puVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_rhw = uVar2 & 0xffffffc0
  ;
  if (((uVar2 & 0x7f800000) < 0xa800000 &
      4 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset &
      *(byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_c + 1)
      >> 1) == 1) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_rhw =
         uVar2 & 0x80000000 | 0xa800000;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *(byte *)puVar1 = (byte)*puVar1 | 4;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    bVar3 = (byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  d3d56_tlv_fog_tri_col1 & 0xf;
  }
  else {
    bVar3 = (byte)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
  *puVar1 = *puVar1 & ~(uint)(1L << (bVar3 & 0x3f));
  return;
}

Assistant:

void emulate_mthd() override {
		exp.d3d56_tlv_rhw = val & ~0x3f;
		if (extr(exp.debug_c, 9, 1) && chipset.chipset >= 5) {
			if (extr(exp.d3d56_tlv_rhw, 0, 31) < 0xa800000)
				insrt(exp.d3d56_tlv_rhw, 0, 31, 0xa800000);
		}
		insrt(exp.valid[1], 2, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}